

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O2

DecodeStatus
DecodeMSA128BRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,MCRegisterInfo *Decoder)

{
  DecodeStatus DVar1;
  uint Reg;
  
  DVar1 = MCDisassembler_Fail;
  if (RegNo < 0x20) {
    Reg = getReg(Decoder,0x2a,RegNo);
    MCOperand_CreateReg0(Inst,Reg);
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeMSA128BRegisterClass(MCInst *Inst,
		unsigned RegNo, uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned Reg;

	if (RegNo > 31)
		return MCDisassembler_Fail;

	Reg = getReg(Decoder, Mips_MSA128BRegClassID, RegNo);
	MCOperand_CreateReg0(Inst, Reg);

	return MCDisassembler_Success;
}